

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.h
# Opt level: O0

void __thiscall mocker::nasm::Section::emplaceLine<mocker::nasm::Ret>(Section *this,string *label)

{
  shared_ptr<mocker::nasm::Ret> local_28;
  string *local_18;
  string *label_local;
  Section *this_local;
  
  local_18 = label;
  label_local = &this->name;
  std::make_shared<mocker::nasm::Ret>();
  std::__cxx11::list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>::
  emplace_back<std::__cxx11::string,std::shared_ptr<mocker::nasm::Ret>>
            ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>> *)&this->lines,label,
             &local_28);
  std::shared_ptr<mocker::nasm::Ret>::~shared_ptr(&local_28);
  return;
}

Assistant:

void emplaceLine(std::string label, Args &&... args) {
    lines.emplace_back(std::move(label),
                       std::make_shared<Type>(std::forward<Args>(args)...));
  }